

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

LinearSpace3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::computeAlignedSpaceMB
          (LinearSpace3fa *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,size_t primID,BBox1f time_range)

{
  BBox1f BVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  undefined8 uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar18 [64];
  float fVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  undefined1 auVar21 [16];
  float fVar22;
  vfloat4 a0;
  undefined1 auVar23 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar33 [12];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  
  auVar18._8_56_ = in_register_00001208;
  auVar18._0_8_ = time_range;
  BVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          super_Geometry.time_range;
  auVar14._8_8_ = 0;
  auVar14._0_4_ = BVar1.lower;
  auVar14._4_4_ = BVar1.upper;
  fVar22 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           super_Geometry.fnumTimeSegments;
  fVar19 = BVar1.lower;
  auVar14 = vmovshdup_avx(auVar14);
  fVar34 = auVar14._0_4_ - fVar19;
  auVar17 = vmovshdup_avx(auVar18._0_16_);
  auVar14 = ZEXT416((uint)(fVar22 * ((time_range.lower - fVar19) / fVar34) * 1.0000002));
  auVar14 = vroundss_avx(auVar14,auVar14,9);
  auVar14 = vmaxss_avx(ZEXT816(0),auVar14);
  auVar17 = ZEXT416((uint)(fVar22 * ((auVar17._0_4_ - fVar19) / fVar34) * 0.99999976));
  auVar17 = vroundss_avx(auVar17,auVar17,10);
  auVar17 = vminss_avx(auVar17,ZEXT416((uint)fVar22));
  if ((int)auVar17._0_4_ == (int)auVar14._0_4_) {
    auVar14 = vdpps_avx(_DAT_01fb04e0,_DAT_01fb04e0,0x7f);
    auVar23 = SUB6416(ZEXT464(0xbf800000),0);
    auVar17 = vdpps_avx(auVar23,auVar23,0x7f);
    uVar6 = vcmpps_avx512vl(auVar17,auVar14,1);
    auVar14 = vpmovm2d_avx512vl(uVar6);
    auVar15._0_4_ = auVar14._0_4_;
    auVar15._4_4_ = auVar15._0_4_;
    auVar15._8_4_ = auVar15._0_4_;
    auVar15._12_4_ = auVar15._0_4_;
    uVar12 = vpmovd2m_avx512vl(auVar15);
    auVar14 = vpcmpeqd_avx(auVar15,auVar15);
    auVar13._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar14._4_4_;
    auVar13._0_4_ = (uint)((byte)uVar12 & 1) * auVar14._0_4_;
    auVar13._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar14._8_4_;
    auVar13._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar14._12_4_;
    auVar14 = vblendvps_avx(auVar23,_DAT_01fb04e0,auVar13);
    auVar17 = vdpps_avx(auVar14,auVar14,0x7f);
    auVar13 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar17._0_4_));
    fVar22 = auVar13._0_4_;
    fVar22 = fVar22 * 1.5 - auVar17._0_4_ * 0.5 * fVar22 * fVar22 * fVar22;
    aVar20._0_4_ = auVar14._0_4_ * fVar22;
    aVar20._4_4_ = auVar14._4_4_ * fVar22;
    aVar20._8_4_ = auVar14._8_4_ * fVar22;
    aVar20._12_4_ = auVar14._12_4_ * fVar22;
    auVar14 = vshufps_avx((undefined1  [16])aVar20,(undefined1  [16])aVar20,0xc9);
    auVar23._0_4_ = aVar20._0_4_ * -0.0;
    auVar23._4_4_ = aVar20._4_4_ * -1.0;
    auVar23._8_4_ = aVar20._8_4_ * -0.0;
    auVar23._12_4_ = aVar20._12_4_ * -0.0;
    auVar14 = vfmadd231ps_fma(auVar23,_DAT_01f7b700,auVar14);
    auVar17 = vshufps_avx(auVar14,auVar14,0xc9);
    auVar14 = vdpps_avx(auVar17,auVar17,0x7f);
    auVar13 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar14._0_4_));
    fVar22 = auVar13._0_4_;
    fVar22 = fVar22 * 1.5 - auVar14._0_4_ * 0.5 * fVar22 * fVar22 * fVar22;
    aVar24._0_4_ = fVar22 * auVar17._0_4_;
    aVar24._4_4_ = fVar22 * auVar17._4_4_;
    aVar24._8_4_ = fVar22 * auVar17._8_4_;
    aVar24._12_4_ = fVar22 * auVar17._12_4_;
    auVar17 = _DAT_01f7b700;
  }
  else {
    iVar8 = ((int)auVar14._0_4_ + (int)auVar17._0_4_) / 2;
    pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
             vertices.items;
    uVar2 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                super_CurveGeometry.super_Geometry.field_0x58 +
                     primID * *(long *)&(this->
                                        super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                        super_CurveGeometry.field_0x68);
    pcVar4 = pBVar3[iVar8].super_RawBufferView.ptr_ofs;
    sVar5 = pBVar3[iVar8].super_RawBufferView.stride;
    lVar11 = sVar5 * uVar2;
    lVar10 = sVar5 * (uVar2 + 1);
    pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
             tangents.items;
    sVar5 = pBVar3[iVar8].super_RawBufferView.stride;
    lVar7 = uVar2 * sVar5;
    lVar9 = sVar5 * (uVar2 + 1);
    fVar22 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
             maxRadiusScale;
    auVar13 = vinsertps_avx(*(undefined1 (*) [16])(pcVar4 + lVar11),
                            ZEXT416((uint)(fVar22 * *(float *)(pcVar4 + lVar11 + 0xc))),0x30);
    auVar15 = vinsertps_avx(*(undefined1 (*) [16])(pcVar4 + lVar10),
                            ZEXT416((uint)(fVar22 * *(float *)(pcVar4 + lVar10 + 0xc))),0x30);
    auVar25 = ZEXT816(0) << 0x20;
    auVar23 = vsubps_avx(auVar15,auVar13);
    auVar14 = vdpps_avx(auVar23,auVar23,0x7f);
    fVar19 = auVar14._0_4_;
    auVar37._4_12_ = SUB1612(ZEXT816(0),0);
    auVar37._0_4_ = fVar19;
    auVar14 = vrsqrt14ss_avx512f(auVar25,auVar37);
    fVar34 = auVar14._0_4_;
    fVar34 = fVar34 * 1.5 + fVar19 * -0.5 * fVar34 * fVar34 * fVar34;
    auVar17._0_4_ = auVar23._0_4_ * fVar34;
    auVar17._4_4_ = auVar23._4_4_ * fVar34;
    auVar17._8_4_ = auVar23._8_4_ * fVar34;
    auVar17._12_4_ = auVar23._12_4_ * fVar34;
    if (1e-18 < fVar19) {
      pcVar4 = pBVar3[iVar8].super_RawBufferView.ptr_ofs;
      auVar14 = vinsertps_avx(*(undefined1 (*) [16])(pcVar4 + lVar7),
                              ZEXT416((uint)(fVar22 * *(float *)(pcVar4 + lVar7 + 0xc))),0x30);
      auVar23 = vinsertps_avx(*(undefined1 (*) [16])(pcVar4 + lVar9),
                              ZEXT416((uint)(fVar22 * *(float *)(pcVar4 + lVar9 + 0xc))),0x30);
      auVar38._8_4_ = 0xbeaaaaab;
      auVar38._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar38._12_4_ = 0xbeaaaaab;
      auVar37 = vfnmadd213ps_fma(auVar14,auVar38,auVar13);
      auVar14 = vfmadd213ps_fma(auVar23,auVar38,auVar15);
      auVar28._0_4_ = auVar15._0_4_ * 0.0;
      auVar28._4_4_ = auVar15._4_4_ * 0.0;
      auVar28._8_4_ = auVar15._8_4_ * 0.0;
      auVar28._12_4_ = auVar15._12_4_ * 0.0;
      auVar14 = vfmadd231ps_fma(auVar28,auVar25,auVar14);
      auVar25._8_4_ = 0xc0400000;
      auVar25._0_8_ = 0xc0400000c0400000;
      auVar25._12_4_ = 0xc0400000;
      auVar14 = vfnmadd231ps_fma(auVar14,auVar25,auVar37);
      auVar15 = vfmadd231ps_fma(auVar14,auVar13,auVar25);
      auVar14 = vshufps_avx(auVar15,auVar15,0xc9);
      auVar13 = vshufps_avx(auVar17,auVar17,0xc9);
      auVar26._0_4_ = auVar15._0_4_ * auVar13._0_4_;
      auVar26._4_4_ = auVar15._4_4_ * auVar13._4_4_;
      auVar26._8_4_ = auVar15._8_4_ * auVar13._8_4_;
      auVar26._12_4_ = auVar15._12_4_ * auVar13._12_4_;
      auVar14 = vfmsub231ps_fma(auVar26,auVar17,auVar14);
      auVar14 = vshufps_avx(auVar14,auVar14,0xc9);
    }
    else {
      auVar14 = ZEXT816(0x3f80000000000000);
      auVar17 = _DAT_01f7b700;
    }
    auVar13 = vdpps_avx(auVar14,auVar14,0x7f);
    fVar22 = auVar13._0_4_;
    if (fVar22 <= 1e-18) {
      auVar13 = vshufpd_avx(auVar17,auVar17,1);
      auVar14 = vmovshdup_avx(auVar17);
      auVar29._8_4_ = 0x80000000;
      auVar29._0_8_ = 0x8000000080000000;
      auVar29._12_4_ = 0x80000000;
      auVar27._0_4_ = auVar14._0_4_ ^ 0x80000000;
      auVar33 = ZEXT812(0) << 0x20;
      auVar25 = ZEXT816(0) << 0x40;
      auVar14 = vunpckhps_avx(auVar17,auVar25);
      auVar27._4_12_ = auVar33;
      auVar23 = vshufps_avx(auVar14,auVar27,0x41);
      auVar14 = vdpps_avx(auVar23,auVar23,0x7f);
      auVar21._0_8_ = auVar13._0_8_ ^ 0x8000000080000000;
      auVar21._8_8_ = auVar13._8_8_ ^ auVar29._8_8_;
      auVar15 = vinsertps_avx(auVar21,auVar17,0x2a);
      auVar13 = vdpps_avx(auVar15,auVar15,0x7f);
      uVar6 = vcmpps_avx512vl(auVar13,auVar14,1);
      auVar14 = vpmovm2d_avx512vl(uVar6);
      auVar30._0_4_ = auVar14._0_4_;
      auVar30._4_4_ = auVar30._0_4_;
      auVar30._8_4_ = auVar30._0_4_;
      auVar30._12_4_ = auVar30._0_4_;
      uVar12 = vpmovd2m_avx512vl(auVar30);
      auVar14 = vpcmpeqd_avx(auVar30,auVar30);
      auVar16._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar14._4_4_;
      auVar16._0_4_ = (uint)((byte)uVar12 & 1) * auVar14._0_4_;
      auVar16._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar14._8_4_;
      auVar16._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar14._12_4_;
      auVar14 = vblendvps_avx(auVar15,auVar23,auVar16);
      auVar13 = vdpps_avx(auVar14,auVar14,0x7f);
      auVar31._4_12_ = auVar33;
      auVar31._0_4_ = auVar13._0_4_;
      auVar15 = vrsqrt14ss_avx512f(auVar25,auVar31);
      fVar22 = auVar15._0_4_;
      fVar22 = fVar22 * 1.5 - auVar13._0_4_ * 0.5 * fVar22 * fVar22 * fVar22;
      aVar20._0_4_ = auVar14._0_4_ * fVar22;
      aVar20._4_4_ = auVar14._4_4_ * fVar22;
      aVar20._8_4_ = auVar14._8_4_ * fVar22;
      aVar20._12_4_ = auVar14._12_4_ * fVar22;
      auVar14 = vshufps_avx((undefined1  [16])aVar20,(undefined1  [16])aVar20,0xc9);
      auVar13 = vshufps_avx(auVar17,auVar17,0xc9);
      auVar32._0_4_ = aVar20._0_4_ * auVar13._0_4_;
      auVar32._4_4_ = aVar20._4_4_ * auVar13._4_4_;
      auVar32._8_4_ = aVar20._8_4_ * auVar13._8_4_;
      auVar32._12_4_ = aVar20._12_4_ * auVar13._12_4_;
      auVar14 = vfmsub231ps_fma(auVar32,auVar17,auVar14);
      auVar13 = vshufps_avx(auVar14,auVar14,0xc9);
      auVar14 = vdpps_avx(auVar13,auVar13,0x7f);
      auVar40._4_12_ = auVar33;
      auVar40._0_4_ = auVar14._0_4_;
      auVar15 = vrsqrt14ss_avx512f(auVar25,auVar40);
      fVar22 = auVar15._0_4_;
      fVar22 = fVar22 * 1.5 - auVar14._0_4_ * 0.5 * fVar22 * fVar22 * fVar22;
      aVar24._0_4_ = fVar22 * auVar13._0_4_;
      aVar24._4_4_ = fVar22 * auVar13._4_4_;
      aVar24._8_4_ = fVar22 * auVar13._8_4_;
      aVar24._12_4_ = fVar22 * auVar13._12_4_;
    }
    else {
      auVar33 = SUB1612(ZEXT416(0),0) << 0x20;
      auVar15 = ZEXT416(0) << 0x40;
      auVar35._4_12_ = auVar33;
      auVar35._0_4_ = fVar22;
      auVar13 = vrsqrt14ss_avx512f(auVar15,auVar35);
      fVar34 = auVar13._0_4_;
      fVar22 = fVar34 * 1.5 - fVar22 * 0.5 * fVar34 * fVar34 * fVar34;
      aVar24._0_4_ = auVar14._0_4_ * fVar22;
      aVar24._4_4_ = auVar14._4_4_ * fVar22;
      aVar24._8_4_ = auVar14._8_4_ * fVar22;
      aVar24._12_4_ = auVar14._12_4_ * fVar22;
      auVar14 = vshufps_avx(auVar17,auVar17,0xc9);
      auVar13 = vshufps_avx((undefined1  [16])aVar24,(undefined1  [16])aVar24,0xc9);
      auVar36._0_4_ = auVar17._0_4_ * auVar13._0_4_;
      auVar36._4_4_ = auVar17._4_4_ * auVar13._4_4_;
      auVar36._8_4_ = auVar17._8_4_ * auVar13._8_4_;
      auVar36._12_4_ = auVar17._12_4_ * auVar13._12_4_;
      auVar14 = vfmsub231ps_fma(auVar36,(undefined1  [16])aVar24,auVar14);
      auVar13 = vshufps_avx(auVar14,auVar14,0xc9);
      auVar14 = vdpps_avx(auVar13,auVar13,0x7f);
      auVar39._4_12_ = auVar33;
      auVar39._0_4_ = auVar14._0_4_;
      auVar15 = vrsqrt14ss_avx512f(auVar15,auVar39);
      fVar22 = auVar15._0_4_;
      fVar22 = fVar22 * 1.5 - auVar14._0_4_ * 0.5 * fVar22 * fVar22 * fVar22;
      aVar20._0_4_ = fVar22 * auVar13._0_4_;
      aVar20._4_4_ = fVar22 * auVar13._4_4_;
      aVar20._8_4_ = fVar22 * auVar13._8_4_;
      aVar20._12_4_ = fVar22 * auVar13._12_4_;
    }
  }
  (__return_storage_ptr__->vx).field_0 = aVar20;
  (__return_storage_ptr__->vy).field_0 = aVar24;
  *(undefined1 (*) [16])(__return_storage_ptr__->vz).field_0.m128 = auVar17;
  return __return_storage_ptr__;
}

Assistant:

LinearSpace3fa computeAlignedSpaceMB(const size_t primID, const BBox1f time_range) const
      {
        Vec3fa axisz(0,0,1);
        Vec3fa axisy(0,1,0);

        const range<int> tbounds = this->timeSegmentRange(time_range);
        if (tbounds.size() == 0) return frame(axisz);
        
        const size_t t = (tbounds.begin()+tbounds.end())/2;
        const Curve3ff curve = getCurveScaledRadius(primID,t);
        const Vec3fa p0 = curve.begin();
        const Vec3fa p3 = curve.end();
        const Vec3fa d0 = curve.eval_du(0.0f);
        //const Vec3fa d1 = curve.eval_du(1.0f);
        const Vec3fa axisz_ = normalize(p3 - p0);
        const Vec3fa axisy_ = cross(axisz_,d0);
        if (sqr_length(p3-p0) > 1E-18f) {
          axisz = axisz_;
          axisy = axisy_;
        }
        
        if (sqr_length(axisy) > 1E-18) {
          axisy = normalize(axisy);
          Vec3fa axisx = normalize(cross(axisy,axisz));
          return LinearSpace3fa(axisx,axisy,axisz);
        }
        return frame(axisz);
      }